

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack8.h
# Opt level: O0

void ncnn::pooling3x3s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  long lVar17;
  int iVar18;
  long *in_RSI;
  long *in_RDI;
  __m256 _max1;
  __m256 _max0;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _max11_1;
  __m256 _max10_1;
  __m256 _r24_1;
  __m256 _r23_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _max01_1;
  __m256 _max00_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _max31;
  __m256 _max30;
  __m256 _r28;
  __m256 _r27;
  __m256 _r18;
  __m256 _r17;
  __m256 _r08;
  __m256 _r07;
  __m256 _max21;
  __m256 _max20;
  __m256 _r26;
  __m256 _r25;
  __m256 _r16;
  __m256 _r15;
  __m256 _r06;
  __m256 _r05;
  __m256 _max11;
  __m256 _max10;
  __m256 _r24;
  __m256 _r23;
  __m256 _r14;
  __m256 _r13;
  __m256 _r04;
  __m256 _r03;
  __m256 _max01;
  __m256 _max00;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  int i;
  float *r2;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  int local_1450;
  int local_144c;
  undefined1 (*local_1448) [32];
  undefined1 (*local_1440) [32];
  undefined1 (*local_1438) [32];
  undefined1 (*local_13d8) [32];
  int local_1388;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  
  lVar16 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar17 = in_RSI[6];
  iVar18 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 8;
  for (local_1388 = 0; local_1388 < (int)lVar16; local_1388 = local_1388 + 1) {
    local_1438 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_1388 * in_RDI[2]);
    local_13d8 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_1388 * in_RSI[2]);
    local_1440 = (undefined1 (*) [32])
                 (*local_1438 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_1448 = (undefined1 (*) [32])
                 (*local_1438 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    for (local_144c = 0; local_144c < (int)lVar17; local_144c = local_144c + 1) {
      for (local_1450 = 0; local_1450 + 3 < iVar1; local_1450 = local_1450 + 4) {
        auVar6 = local_1438[2];
        auVar9 = local_1440[2];
        auVar12 = local_1448[2];
        auVar2 = vmaxps_avx(*local_1438,local_1438[1]);
        auVar2 = vmaxps_avx(auVar2,local_1438[2]);
        auVar2 = vmaxps_avx(auVar2,*local_1440);
        auVar2 = vmaxps_avx(auVar2,local_1440[1]);
        auVar3 = vmaxps_avx(local_1440[2],*local_1448);
        auVar3 = vmaxps_avx(auVar3,local_1448[1]);
        auVar3 = vmaxps_avx(auVar3,local_1448[2]);
        auVar4 = local_1438[3];
        auVar13 = local_1438[4];
        auVar5 = local_1438[4];
        auVar7 = local_1440[3];
        auVar14 = local_1440[4];
        auVar8 = local_1440[4];
        auVar10 = local_1448[3];
        auVar15 = local_1448[4];
        auVar11 = local_1448[4];
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_1e0 = auVar2._0_8_;
        uStack_1d8 = auVar2._8_8_;
        uStack_1d0 = auVar2._16_8_;
        uStack_1c8 = auVar2._24_8_;
        *(undefined8 *)*local_13d8 = local_1e0;
        *(undefined8 *)(*local_13d8 + 8) = uStack_1d8;
        *(undefined8 *)(*local_13d8 + 0x10) = uStack_1d0;
        *(undefined8 *)(*local_13d8 + 0x18) = uStack_1c8;
        auVar2 = vmaxps_avx(auVar4,auVar5);
        auVar2 = vmaxps_avx(auVar2,auVar6);
        auVar2 = vmaxps_avx(auVar2,auVar7);
        auVar2 = vmaxps_avx(auVar2,auVar8);
        auVar3 = vmaxps_avx(auVar9,auVar10);
        auVar2 = vmaxps_avx(auVar2,auVar11);
        auVar2 = vmaxps_avx(auVar2,auVar12);
        auVar4 = local_1438[5];
        auVar10 = local_1438[6];
        auVar5 = local_1438[6];
        auVar6 = local_1440[5];
        auVar11 = local_1440[6];
        auVar7 = local_1440[6];
        auVar8 = local_1448[5];
        auVar12 = local_1448[6];
        auVar9 = local_1448[6];
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_220 = auVar2._0_8_;
        uStack_218 = auVar2._8_8_;
        uStack_210 = auVar2._16_8_;
        uStack_208 = auVar2._24_8_;
        *(undefined8 *)local_13d8[1] = local_220;
        *(undefined8 *)(local_13d8[1] + 8) = uStack_218;
        *(undefined8 *)(local_13d8[1] + 0x10) = uStack_210;
        *(undefined8 *)(local_13d8[1] + 0x18) = uStack_208;
        auVar2 = vmaxps_avx(auVar4,auVar5);
        auVar2 = vmaxps_avx(auVar2,auVar13);
        auVar2 = vmaxps_avx(auVar2,auVar6);
        auVar2 = vmaxps_avx(auVar2,auVar7);
        auVar3 = vmaxps_avx(auVar14,auVar8);
        auVar2 = vmaxps_avx(auVar2,auVar9);
        auVar2 = vmaxps_avx(auVar2,auVar15);
        auVar4 = local_1438[7];
        auVar5 = local_1438[8];
        auVar6 = local_1440[7];
        auVar7 = local_1440[8];
        auVar8 = local_1448[7];
        auVar9 = local_1448[8];
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_260 = auVar2._0_8_;
        uStack_258 = auVar2._8_8_;
        uStack_250 = auVar2._16_8_;
        uStack_248 = auVar2._24_8_;
        *(undefined8 *)local_13d8[2] = local_260;
        *(undefined8 *)(local_13d8[2] + 8) = uStack_258;
        *(undefined8 *)(local_13d8[2] + 0x10) = uStack_250;
        *(undefined8 *)(local_13d8[2] + 0x18) = uStack_248;
        auVar2 = vmaxps_avx(auVar4,auVar5);
        auVar2 = vmaxps_avx(auVar2,auVar10);
        auVar2 = vmaxps_avx(auVar2,auVar6);
        auVar2 = vmaxps_avx(auVar2,auVar7);
        auVar3 = vmaxps_avx(auVar11,auVar8);
        auVar2 = vmaxps_avx(auVar2,auVar9);
        auVar2 = vmaxps_avx(auVar2,auVar12);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_13d8[3] = auVar2;
        local_1438 = local_1438 + 8;
        local_1440 = local_1440 + 8;
        local_1448 = local_1448 + 8;
        local_13d8 = local_13d8 + 4;
      }
      for (; local_1450 + 1 < iVar1; local_1450 = local_1450 + 2) {
        auVar6 = local_1438[2];
        auVar9 = local_1440[2];
        auVar12 = local_1448[2];
        auVar2 = vmaxps_avx(*local_1438,local_1438[1]);
        auVar2 = vmaxps_avx(auVar2,local_1438[2]);
        auVar2 = vmaxps_avx(auVar2,*local_1440);
        auVar2 = vmaxps_avx(auVar2,local_1440[1]);
        auVar3 = vmaxps_avx(local_1440[2],*local_1448);
        auVar3 = vmaxps_avx(auVar3,local_1448[1]);
        auVar3 = vmaxps_avx(auVar3,local_1448[2]);
        auVar4 = local_1438[3];
        auVar5 = local_1438[4];
        auVar7 = local_1440[3];
        auVar8 = local_1440[4];
        auVar10 = local_1448[3];
        auVar11 = local_1448[4];
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_2e0 = auVar2._0_8_;
        uStack_2d8 = auVar2._8_8_;
        uStack_2d0 = auVar2._16_8_;
        uStack_2c8 = auVar2._24_8_;
        *(undefined8 *)*local_13d8 = local_2e0;
        *(undefined8 *)(*local_13d8 + 8) = uStack_2d8;
        *(undefined8 *)(*local_13d8 + 0x10) = uStack_2d0;
        *(undefined8 *)(*local_13d8 + 0x18) = uStack_2c8;
        auVar2 = vmaxps_avx(auVar4,auVar5);
        auVar2 = vmaxps_avx(auVar2,auVar6);
        auVar2 = vmaxps_avx(auVar2,auVar7);
        auVar2 = vmaxps_avx(auVar2,auVar8);
        auVar3 = vmaxps_avx(auVar9,auVar10);
        auVar2 = vmaxps_avx(auVar2,auVar11);
        auVar2 = vmaxps_avx(auVar2,auVar12);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_13d8[1] = auVar2;
        local_1438 = local_1438 + 4;
        local_1440 = local_1440 + 4;
        local_1448 = local_1448 + 4;
        local_13d8 = local_13d8 + 2;
      }
      for (; local_1450 < iVar1; local_1450 = local_1450 + 1) {
        auVar2 = vmaxps_avx(*local_1438,local_1438[1]);
        auVar2 = vmaxps_avx(auVar2,local_1438[2]);
        auVar2 = vmaxps_avx(auVar2,*local_1440);
        auVar2 = vmaxps_avx(auVar2,local_1440[1]);
        auVar3 = vmaxps_avx(local_1440[2],*local_1448);
        auVar3 = vmaxps_avx(auVar3,local_1448[1]);
        auVar3 = vmaxps_avx(auVar3,local_1448[2]);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        *local_13d8 = auVar2;
        local_1438 = local_1438 + 2;
        local_1440 = local_1440 + 2;
        local_1448 = local_1448 + 2;
        local_13d8 = local_13d8 + 1;
      }
      local_1438 = (undefined1 (*) [32])(*local_1438 + (long)iVar18 * 4);
      local_1440 = (undefined1 (*) [32])(*local_1440 + (long)iVar18 * 4);
      local_1448 = (undefined1 (*) [32])(*local_1448 + (long)iVar18 * 4);
    }
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                __m256 _max20 = _mm256_max_ps(_r05, _r06);
                _max20 = _mm256_max_ps(_max20, _r04);
                _max20 = _mm256_max_ps(_max20, _r15);
                _max20 = _mm256_max_ps(_max20, _r16);
                __m256 _max21 = _mm256_max_ps(_r14, _r25);
                _max20 = _mm256_max_ps(_max20, _r26);
                _max20 = _mm256_max_ps(_max20, _r24);

                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);

                _mm256_storeu_ps(outptr + 16, _mm256_max_ps(_max20, _max21));

                __m256 _max30 = _mm256_max_ps(_r07, _r08);
                _max30 = _mm256_max_ps(_max30, _r06);
                _max30 = _mm256_max_ps(_max30, _r17);
                _max30 = _mm256_max_ps(_max30, _r18);
                __m256 _max31 = _mm256_max_ps(_r16, _r27);
                _max30 = _mm256_max_ps(_max30, _r28);
                _max30 = _mm256_max_ps(_max30, _r26);

                _mm256_storeu_ps(outptr + 24, _mm256_max_ps(_max30, _max31));

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr += 16;
            }

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                _max0 = _mm256_max_ps(_max0, _r02);
                _max0 = _mm256_max_ps(_max0, _r10);
                _max0 = _mm256_max_ps(_max0, _r11);
                __m256 _max1 = _mm256_max_ps(_r12, _r20);
                _max1 = _mm256_max_ps(_max1, _r21);
                _max1 = _mm256_max_ps(_max1, _r22);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max0, _max1));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}